

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

void __thiscall
cmUuid::CreateHashInput
          (cmUuid *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,
          string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  reference pvVar4;
  void *__src;
  size_t __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output_local;
  string *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace_local;
  cmUuid *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(output,uuidNamespace);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(output);
    lVar3 = std::__cxx11::string::size();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(output,sVar2 + lVar3);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](output,0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(uuidNamespace);
    __src = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    memcpy(pvVar4 + sVar2,__src,__n);
  }
  return;
}

Assistant:

void cmUuid::CreateHashInput(std::vector<unsigned char> const& uuidNamespace,
  std::string const& name, std::vector<unsigned char> &output) const
{
  output = uuidNamespace;

  if(!name.empty())
    {
    output.resize(output.size() + name.size());

    memcpy(&output[0] + uuidNamespace.size(),
      name.c_str(), name.size());
    }
}